

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O2

bool __thiscall
EOPlus::Parser::GetTokenIf
          (Parser *this,Token *t,function<bool_(const_EOPlus::Token_&)> *f,uint allow)

{
  Parser_Token_Server_Base *this_00;
  bool bVar1;
  undefined1 local_100 [80];
  undefined1 local_b0 [64];
  undefined1 local_70 [80];
  
  Parser_Token_Server_Base::GetToken
            ((Token *)local_100,
             (this->tok)._M_t.
             super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
             ._M_t.
             super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
             .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl,allow);
  Token::operator=(t,(Token *)local_100);
  std::__cxx11::string::~string((string *)(local_100 + 0x18));
  if (t->type != Invalid) {
    bVar1 = std::function<bool_(const_EOPlus::Token_&)>::operator()(f,t);
    if (!bVar1) {
      this_00 = (this->tok)._M_t.
                super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                ._M_t.
                super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
      Token::Token((Token *)local_70,t);
      Parser_Token_Server_Base::PutBack(this_00,(Token *)local_70);
      std::__cxx11::string::~string((string *)(local_70 + 0x18));
      util::variant::variant((variant *)local_b0);
      Token::Token((Token *)local_100,Invalid,(variant *)local_b0);
      Token::operator=(t,(Token *)local_100);
      std::__cxx11::string::~string((string *)(local_100 + 0x18));
      std::__cxx11::string::~string((string *)(local_b0 + 0x10));
    }
  }
  return t->type != Invalid;
}

Assistant:

bool GetTokenIf(Token& t, std::function<bool(const Token&)> f, unsigned int allow = 0xFFFFFFFF)
			{
				t = this->tok->GetToken(allow);

				if (t && !f(t))
				{
					this->tok->PutBack(t);
					t = Token();
				}

				return bool(t);
			}